

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall smf::Binasc::processAsciiWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  uchar *puVar4;
  uchar local_31;
  uchar outputByte;
  int length;
  int lineNum_local;
  string *word_local;
  ostream *out_local;
  Binasc *this_local;
  
  iVar1 = std::__cxx11::string::size();
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)word);
  if (*pcVar2 == '+') {
    if (iVar1 < 3) {
      if (iVar1 == 2) {
        puVar4 = (uchar *)std::__cxx11::string::operator[]((ulong)word);
        local_31 = *puVar4;
      }
      else {
        local_31 = ' ';
      }
      std::operator<<(out,local_31);
      this_local._4_4_ = 1;
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
      poVar3 = std::operator<<(poVar3," at token: ");
      poVar3 = std::operator<<(poVar3,(string *)word);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "character byte word is too long -- specify only one character");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_local._4_4_ = 0;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
    poVar3 = std::operator<<(poVar3," at token: ");
    poVar3 = std::operator<<(poVar3,(string *)word);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cerr,"character byte must start with \'+\' sign: ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Binasc::processAsciiWord(std::ostream& out, const std::string& word,
		int lineNum) {
	int length = (int)word.size();
	uchar outputByte;

	if (word[0] != '+') {
		std::cerr << "Error on line " << lineNum << " at token: " << word << std::endl;
		std::cerr << "character byte must start with \'+\' sign: " << std::endl;
		return 0;
	}

	if (length > 2) {
		std::cerr << "Error on line " << lineNum << " at token: " << word << std::endl;
		std::cerr << "character byte word is too long -- specify only one character"
			  << std::endl;
		return 0;
	}

	if (length == 2) {
		outputByte = (uchar)word[1];
	} else {
		outputByte = ' ';
	}
	out << outputByte;
	return 1;
}